

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibraryLinux.cpp
# Opt level: O1

void __thiscall Diligent::DXCompilerLibrary::Load(DXCompilerLibrary *this)

{
  void *pvVar1;
  DxcCreateInstanceProc p_Var2;
  
  if ((this->m_LibName)._M_string_length != 0) {
    pvVar1 = (void *)dlopen((this->m_LibName)._M_dataplus._M_p,1);
    this->m_Library = pvVar1;
  }
  if (this->m_Library == (void *)0x0) {
    pvVar1 = (void *)dlopen("libdxcompiler.so",1);
    this->m_Library = pvVar1;
  }
  if (this->m_Library == (void *)0x0) {
    pvVar1 = (void *)dlopen("/usr/lib/dxc/libdxcompiler.so",1);
    this->m_Library = pvVar1;
  }
  if (this->m_Library == (void *)0x0) {
    p_Var2 = (DxcCreateInstanceProc)0x0;
  }
  else {
    p_Var2 = (DxcCreateInstanceProc)dlsym(this->m_Library,"DxcCreateInstance");
  }
  this->m_DxcCreateInstance = p_Var2;
  return;
}

Assistant:

void DXCompilerLibrary::Load()
{
    if (!m_LibName.empty())
        m_Library = dlopen(m_LibName.c_str(), RTLD_LOCAL | RTLD_LAZY);

    if (m_Library == nullptr)
        m_Library = dlopen("libdxcompiler.so", RTLD_LOCAL | RTLD_LAZY);

    // try to load from default path
    if (m_Library == nullptr)
        m_Library = dlopen("/usr/lib/dxc/libdxcompiler.so", RTLD_LOCAL | RTLD_LAZY);

    m_DxcCreateInstance = m_Library != nullptr ? reinterpret_cast<DxcCreateInstanceProc>(dlsym(m_Library, "DxcCreateInstance")) : nullptr;
}